

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

void __thiscall dxil_spv::Converter::Impl::add(Impl *this,Operation *op,bool is_rov)

{
  iterator iVar1;
  vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *pvVar2;
  Operation *local_20;
  Operation *local_18;
  
  pvVar2 = (vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *)
           this->current_block;
  local_18 = op;
  if (pvVar2 == (vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *
                )0x0) {
    __assert_fail("current_block",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/dxil_converter.cpp"
                  ,0x1ecd,"void dxil_spv::Converter::Impl::add(Operation *, bool)");
  }
  if (is_rov) {
    local_20 = SPIRVModule::allocate_op(this->spirv_module,OpBeginInvocationInterlockEXT);
    iVar1._M_current = *(Operation ***)(pvVar2 + 8);
    if (iVar1._M_current == *(Operation ***)(pvVar2 + 0x10)) {
      std::vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>::
      _M_realloc_insert<dxil_spv::Operation*>(pvVar2,iVar1,&local_20);
    }
    else {
      *iVar1._M_current = local_20;
      *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
    }
    pvVar2 = (vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *)
             this->current_block;
    iVar1._M_current = *(Operation ***)(pvVar2 + 8);
    if (iVar1._M_current == *(Operation ***)(pvVar2 + 0x10)) {
      std::vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>::
      _M_realloc_insert<dxil_spv::Operation*const&>(pvVar2,iVar1,&local_18);
    }
    else {
      *iVar1._M_current = local_18;
      *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
    }
    pvVar2 = (vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>> *)
             this->current_block;
    local_20 = SPIRVModule::allocate_op(this->spirv_module,OpEndInvocationInterlockEXT);
    iVar1._M_current = *(Operation ***)(pvVar2 + 8);
    if (iVar1._M_current == *(Operation ***)(pvVar2 + 0x10)) {
      std::vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>::
      _M_realloc_insert<dxil_spv::Operation*>(pvVar2,iVar1,&local_20);
      return;
    }
    *iVar1._M_current = local_20;
  }
  else {
    iVar1._M_current = *(Operation ***)(pvVar2 + 8);
    if (iVar1._M_current == *(Operation ***)(pvVar2 + 0x10)) {
      std::vector<dxil_spv::Operation*,dxil_spv::ThreadLocalAllocator<dxil_spv::Operation*>>::
      _M_realloc_insert<dxil_spv::Operation*const&>(pvVar2,iVar1,&local_18);
      return;
    }
    *iVar1._M_current = op;
  }
  *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
  return;
}

Assistant:

void Converter::Impl::add(Operation *op, bool is_rov)
{
	assert(current_block);
	if (is_rov)
		current_block->push_back(allocate(spv::OpBeginInvocationInterlockEXT));
	current_block->push_back(op);
	if (is_rov)
		current_block->push_back(allocate(spv::OpEndInvocationInterlockEXT));
}